

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
* __thiscall
testing::internal::ElementsAreMatcher::operator_cast_to_Matcher
          (Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
           *__return_storage_ptr__,ElementsAreMatcher *this)

{
  ElementsAreMatcherImpl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
  *this_00;
  MatcherVec matchers;
  
  matchers.
  super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  matchers.
  super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  matchers.
  super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
  ::reserve(&matchers,1);
  TransformTupleValuesHelper<std::tuple<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_testing::internal::CastAndAppendTransform<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::back_insert_iterator<std::vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>_>_>
  ::Run(this,&matchers);
  this_00 = (ElementsAreMatcherImpl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
             *)operator_new(0x20);
  ElementsAreMatcherImpl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
  ::
  ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<std::__cxx11::string_const&>*,std::vector<testing::Matcher<std::__cxx11::string_const&>,std::allocator<testing::Matcher<std::__cxx11::string_const&>>>>>
            (this_00,(__normal_iterator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_std::vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>_>
                      )matchers.
                       super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_std::vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>_>
              )matchers.
               super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::Matcher(__return_storage_ptr__,
            (MatcherInterface<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
             *)this_00);
  std::
  vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
  ::~vector(&matchers);
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Container>() const {
    static_assert(
        !IsHashTable<GTEST_REMOVE_REFERENCE_AND_CONST_(Container)>::value ||
            ::std::tuple_size<MatcherTuple>::value < 2,
        "use UnorderedElementsAre with hash tables");

    typedef GTEST_REMOVE_REFERENCE_AND_CONST_(Container) RawContainer;
    typedef typename internal::StlContainerView<RawContainer>::type View;
    typedef typename View::value_type Element;
    typedef ::std::vector<Matcher<const Element&>> MatcherVec;
    MatcherVec matchers;
    matchers.reserve(::std::tuple_size<MatcherTuple>::value);
    TransformTupleValues(CastAndAppendTransform<const Element&>(), matchers_,
                         ::std::back_inserter(matchers));
    return Matcher<Container>(new ElementsAreMatcherImpl<const Container&>(
        matchers.begin(), matchers.end()));
  }